

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void printMemOperand(MCInst *MI,int opNum,SStream *O,char *Modifier)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  MCOperand *MO;
  char *Modifier_local;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  set_mem_access(MI,true);
  printOperand(MI,opNum,O);
  if ((Modifier == (char *)0x0) || (iVar2 = strcmp(Modifier,"arith"), iVar2 != 0)) {
    op = MCInst_getOperand(MI,opNum + 1);
    _Var1 = MCOperand_isReg(op);
    if ((_Var1) && (uVar3 = MCOperand_getReg(op), uVar3 == 0x47)) {
      set_mem_access(MI,false);
    }
    else {
      _Var1 = MCOperand_isImm(op);
      if ((_Var1) && (iVar4 = MCOperand_getImm(op), iVar4 == 0)) {
        set_mem_access(MI,false);
      }
      else {
        SStream_concat0(O,"+");
        printOperand(MI,opNum + 1,O);
        set_mem_access(MI,false);
      }
    }
  }
  else {
    SStream_concat0(O,", ");
    printOperand(MI,opNum + 1,O);
    set_mem_access(MI,false);
  }
  return;
}

Assistant:

static void printMemOperand(MCInst *MI, int opNum, SStream *O, const char *Modifier)
{
	MCOperand *MO;

	set_mem_access(MI, true);
	printOperand(MI, opNum, O);

	// If this is an ADD operand, emit it like normal operands.
	if (Modifier && !strcmp(Modifier, "arith")) {
		SStream_concat0(O, ", ");
		printOperand(MI, opNum + 1, O);
		set_mem_access(MI, false);
		return;
	}

	MO = MCInst_getOperand(MI, opNum + 1);

	if (MCOperand_isReg(MO) && (MCOperand_getReg(MO) == SP_G0)) {
		set_mem_access(MI, false);
		return;   // don't print "+%g0"
	}

	if (MCOperand_isImm(MO) && (MCOperand_getImm(MO) == 0)) {
		set_mem_access(MI, false);
		return;   // don't print "+0"
	}

	SStream_concat0(O, "+");	// qq

	printOperand(MI, opNum + 1, O);
	set_mem_access(MI, false);
}